

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_id_supported(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_BOOL *has_support)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT geom;
  REF_BOOL *has_support_local;
  REF_INT local_20;
  REF_INT id_local;
  REF_INT type_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  *has_support = 0;
  _status = has_support;
  has_support_local._4_4_ = id;
  local_20 = type;
  id_local = node;
  _type_local = ref_geom;
  ref_geom_local._4_4_ = ref_geom_find(ref_geom,node,type,id,&ref_private_macro_code_rss);
  if (ref_geom_local._4_4_ == 5) {
    *_status = 0;
    ref_geom_local._4_4_ = 0;
  }
  else if (ref_geom_local._4_4_ == 0) {
    *_status = 1;
    ref_geom_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1c7,
           "ref_geom_id_supported",(ulong)ref_geom_local._4_4_,"error testing geom support");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_id_supported(REF_GEOM ref_geom, REF_INT node,
                                         REF_INT type, REF_INT id,
                                         REF_BOOL *has_support) {
  REF_INT geom;
  REF_STATUS status;
  *has_support = REF_FALSE;

  status = ref_geom_find(ref_geom, node, type, id, &geom);
  if (REF_NOT_FOUND == status) { /* no geom support */
    *has_support = REF_FALSE;
    return REF_SUCCESS;
  }
  RSS(status, "error testing geom support");
  *has_support = REF_TRUE;
  return REF_SUCCESS;
}